

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::FunctionObject::
binary<tcu::Matrix<double,_3,_2>,_tcu::Vector<double,_3>,_tcu::Vector<double,_2>_>::call
          (binary<tcu::Matrix<double,_3,_2>,_tcu::Vector<double,_3>,_tcu::Vector<double,_2>_> *this,
          GLvoid *result_dst,GLvoid *argument_src)

{
  undefined4 *puVar1;
  code *pcVar2;
  int row_1;
  GLuint GVar3;
  GLdouble *data;
  int row;
  long lVar4;
  undefined8 uVar5;
  Matrix<double,_3,_2> result;
  undefined8 local_a8 [6];
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined8 local_68 [6];
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  lVar4 = 0;
  GVar3 = GPUShaderFP64Test10::functionObject::getArgumentStride((functionObject *)this,0);
  pcVar2 = (code *)(this->super_binaryBase).super_functionObject.m_p_function;
  local_a8[4] = 0;
  local_a8[5] = 0;
  local_a8[2] = 0;
  local_a8[3] = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  do {
    uVar5 = 0x3ff0000000000000;
    if (lVar4 != 0) {
      uVar5 = 0;
    }
    local_a8[lVar4] = uVar5;
    uVar5 = 0x3ff0000000000000;
    if (lVar4 != 1) {
      uVar5 = 0;
    }
    local_a8[lVar4 + 3] = uVar5;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_28 = *(undefined8 *)((long)argument_src + 0x10);
  local_38 = *argument_src;
  uStack_30 = *(undefined8 *)((long)argument_src + 8);
  puVar1 = (undefined4 *)((long)argument_src + (ulong)GVar3);
  local_78 = *puVar1;
  uStack_74 = puVar1[1];
  uStack_70 = puVar1[2];
  uStack_6c = puVar1[3];
  (*pcVar2)(local_68);
  lVar4 = 0;
  do {
    uVar5 = local_68[lVar4 + 3];
    local_a8[lVar4] = local_68[lVar4];
    local_a8[lVar4 + 3] = uVar5;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  *(undefined8 *)((long)result_dst + 0x10) = local_a8[2];
  *(undefined8 *)result_dst = local_a8[0];
  *(undefined8 *)((long)result_dst + 8) = local_a8[1];
  *(undefined8 *)((long)result_dst + 0x18) = local_a8[3];
  *(undefined8 *)((long)result_dst + 0x20) = local_a8[4];
  *(undefined8 *)((long)result_dst + 0x28) = local_a8[5];
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		const glw::GLuint argument_1_stride = getArgumentStride(0);

		functionPointer p_function = (functionPointer)m_p_function;

		Arg1T arg_1;
		Arg2T arg_2;
		ResT  result;

		unpack<Arg1T>::get(argument_src, arg_1);
		unpack<Arg2T>::get((glw::GLubyte*)argument_src + argument_1_stride, arg_2);

		result = p_function(arg_1, arg_2);

		pack<ResT>::set(result_dst, result);
	}